

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExecuteCommand
          (cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  element_type *peVar1;
  bool bVar2;
  cmValue cVar3;
  long *plVar4;
  ostream *poVar5;
  bool bVar6;
  int iVar7;
  int d;
  pointer local_258;
  string error_1;
  Command command;
  cmMakefileCall stack_manager;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  istringstream s;
  
  bVar2 = IsFunctionBlocked(this,lff,status);
  if (bVar2) {
    return true;
  }
  if ((this->ExecuteCommandCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::function<void_()>::operator()(&this->ExecuteCommandCallback);
  }
  std::
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    *)&local_1d8,
                   &deferId->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  );
  cmMakefileCall::cmMakefileCall
            (&stack_manager,this,lff,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d8,status);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"CMAKE_MAXIMUM_RECURSION_DEPTH",(allocator<char> *)&d);
  cVar3 = GetDefinition(this,(string *)&s);
  std::__cxx11::string::~string((string *)&s);
  if (cVar3.Value == (string *)0x0) {
    iVar7 = 1000;
  }
  else {
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)cVar3.Value,_S_in);
    plVar4 = (long *)std::istream::operator>>(&s,&d);
    iVar7 = 1000;
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      iVar7 = d;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  }
  if (iVar7 < this->RecursionDepth) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar5 = std::operator<<((ostream *)&s,"Maximum recursion depth of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
    std::operator<<(poVar5," exceeded");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,(string *)&d);
    std::__cxx11::string::~string((string *)&d);
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
    bVar6 = false;
    goto LAB_0024292f;
  }
  cmState::GetCommandByExactName
            (&command,(this->GlobalGenerator->CMakeInstance->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
             &((lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->LowerCaseName);
  if (command.super__Function_base._M_manager == (_Manager_type)0x0) {
    bVar2 = cmSystemTools::GetFatalErrorOccurred();
    bVar6 = true;
    if (!bVar2) {
      _s = (pointer)0x17;
      peVar1 = (lff->Impl).
               super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      local_258 = (peVar1->OriginalName)._M_dataplus._M_p;
      _d = (pointer)(peVar1->OriginalName)._M_string_length;
      cmStrCat<char[3]>(&error_1,(cmAlphaNum *)&s,(cmAlphaNum *)&d,(char (*) [3])0x615044);
      IssueMessage(this,FATAL_ERROR,&error_1);
      cmSystemTools::s_FatalErrorOccurred = true;
      std::__cxx11::string::~string((string *)&error_1);
LAB_00242923:
      bVar6 = false;
    }
  }
  else {
    bVar2 = cmSystemTools::GetFatalErrorOccurred();
    bVar6 = true;
    if (!bVar2) {
      if (this->GlobalGenerator->CMakeInstance->Trace == true) {
        PrintCommandTrace(this,lff,&this->Backtrace,No);
      }
      bVar2 = std::
              function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
              ::operator()(&command,&((lff->Impl).
                                      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->Arguments,status);
      if ((!bVar2 | status->NestedError) == 1) {
        if (status->NestedError == false) {
          std::__cxx11::string::string
                    ((string *)&error_1,
                     (string *)
                     (lff->Impl).
                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                         &error_1," ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                         &status->Error);
          std::__cxx11::string::~string((string *)&d);
          std::__cxx11::string::~string((string *)&error_1);
          IssueMessage(this,FATAL_ERROR,(string *)&s);
          std::__cxx11::string::~string((string *)&s);
        }
        if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
          cmSystemTools::s_FatalErrorOccurred = true;
        }
        goto LAB_00242923;
      }
    }
  }
  std::_Function_base::~_Function_base(&command.super__Function_base);
LAB_0024292f:
  cmMakefileCall::~cmMakefileCall(&stack_manager);
  return bVar6;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status,
                                cm::optional<std::string> deferId)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  if (this->ExecuteCommandCallback) {
    this->ExecuteCommandCallback();
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, std::move(deferId), status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  int depth = CMake_DEFAULT_RECURSION_LIMIT;
  cmValue depthStr = this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (depthStr) {
    std::istringstream s(*depthStr);
    int d;
    if (s >> d) {
      depth = d;
    }
  }
  if (this->RecursionDepth > depth) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depth << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Lookup the command prototype.
  if (cmState::Command command =
        this->GetState()->GetCommandByExactName(lff.LowerCaseName())) {
    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff, this->Backtrace);
      }
      // Try invoking the command.
      bool invokeSucceeded = command(lff.Arguments(), status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            std::string(lff.OriginalName()) + " " + status.GetError();
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccurred();
        }
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      std::string error =
        cmStrCat("Unknown CMake command \"", lff.OriginalName(), "\".");
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return result;
}